

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall duckdb_parquet::ColumnMetaData::printTo(ColumnMetaData *this,ostream *out)

{
  ostream *poVar1;
  ostream *in_RSI;
  long in_RDI;
  type *in_stack_fffffffffffffce8;
  string local_258 [39];
  byte local_231;
  string local_230 [39];
  byte local_209;
  string local_208 [39];
  byte local_1e1;
  string local_1e0 [24];
  Statistics *in_stack_fffffffffffffe38;
  string local_1b8 [39];
  byte local_191;
  string local_190 [8];
  vector<duckdb_parquet::Encoding::type,_true> *in_stack_fffffffffffffe78;
  string local_168 [32];
  string local_148 [39];
  byte local_121;
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [48];
  string local_30 [32];
  ostream *local_10;
  
  local_10 = in_RSI;
  std::operator<<(in_RSI,"ColumnMetaData(");
  poVar1 = std::operator<<(local_10,"type=");
  to_string_abi_cxx11_(in_stack_fffffffffffffce8);
  std::operator<<(poVar1,local_30);
  std::__cxx11::string::~string(local_30);
  poVar1 = std::operator<<(local_10,", ");
  poVar1 = std::operator<<(poVar1,"encodings=");
  duckdb_apache::thrift::to_string<duckdb_parquet::Encoding::type>(in_stack_fffffffffffffe78);
  std::operator<<(poVar1,local_60);
  std::__cxx11::string::~string(local_60);
  poVar1 = std::operator<<(local_10,", ");
  poVar1 = std::operator<<(poVar1,"path_in_schema=");
  duckdb_apache::thrift::to_string<std::__cxx11::string>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)in_stack_fffffffffffffe78);
  std::operator<<(poVar1,local_80);
  std::__cxx11::string::~string(local_80);
  poVar1 = std::operator<<(local_10,", ");
  poVar1 = std::operator<<(poVar1,"codec=");
  to_string_abi_cxx11_(in_stack_fffffffffffffce8);
  std::operator<<(poVar1,local_a0);
  std::__cxx11::string::~string(local_a0);
  poVar1 = std::operator<<(local_10,", ");
  poVar1 = std::operator<<(poVar1,"num_values=");
  duckdb_apache::thrift::to_string<long>((long *)in_stack_fffffffffffffe38);
  std::operator<<(poVar1,local_c0);
  std::__cxx11::string::~string(local_c0);
  poVar1 = std::operator<<(local_10,", ");
  poVar1 = std::operator<<(poVar1,"total_uncompressed_size=");
  duckdb_apache::thrift::to_string<long>((long *)in_stack_fffffffffffffe38);
  std::operator<<(poVar1,local_e0);
  std::__cxx11::string::~string(local_e0);
  poVar1 = std::operator<<(local_10,", ");
  poVar1 = std::operator<<(poVar1,"total_compressed_size=");
  duckdb_apache::thrift::to_string<long>((long *)in_stack_fffffffffffffe38);
  std::operator<<(poVar1,local_100);
  std::__cxx11::string::~string(local_100);
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"key_value_metadata=");
  poVar1 = local_10;
  local_121 = 0;
  if ((*(byte *)(in_RDI + 0x1a0) & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::KeyValue>
              ((vector<duckdb_parquet::KeyValue,_true> *)in_stack_fffffffffffffe78);
    local_121 = 1;
    std::operator<<(poVar1,local_120);
  }
  if ((local_121 & 1) != 0) {
    std::__cxx11::string::~string(local_120);
  }
  poVar1 = std::operator<<(local_10,", ");
  poVar1 = std::operator<<(poVar1,"data_page_offset=");
  duckdb_apache::thrift::to_string<long>((long *)in_stack_fffffffffffffe38);
  std::operator<<(poVar1,local_148);
  std::__cxx11::string::~string(local_148);
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"index_page_offset=");
  poVar1 = local_10;
  if ((*(byte *)(in_RDI + 0x1a0) >> 1 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<long>((long *)in_stack_fffffffffffffe38);
    std::operator<<(poVar1,local_168);
    std::__cxx11::string::~string(local_168);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"dictionary_page_offset=");
  local_191 = 0;
  if ((*(byte *)(in_RDI + 0x1a0) >> 2 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    poVar1 = local_10;
    duckdb_apache::thrift::to_string<long>((long *)in_stack_fffffffffffffe38);
    local_191 = 1;
    std::operator<<(poVar1,local_190);
  }
  if ((local_191 & 1) != 0) {
    std::__cxx11::string::~string(local_190);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"statistics=");
  poVar1 = local_10;
  if ((*(byte *)(in_RDI + 0x1a0) >> 3 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::Statistics>(in_stack_fffffffffffffe38);
    std::operator<<(poVar1,local_1b8);
    std::__cxx11::string::~string(local_1b8);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"encoding_stats=");
  poVar1 = local_10;
  local_1e1 = 0;
  if ((*(byte *)(in_RDI + 0x1a0) >> 4 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::PageEncodingStats>
              ((vector<duckdb_parquet::PageEncodingStats,_true> *)in_stack_fffffffffffffe78);
    local_1e1 = 1;
    std::operator<<(poVar1,local_1e0);
  }
  if ((local_1e1 & 1) != 0) {
    std::__cxx11::string::~string(local_1e0);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"bloom_filter_offset=");
  poVar1 = local_10;
  local_209 = 0;
  if ((*(byte *)(in_RDI + 0x1a0) >> 5 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<long>((long *)in_stack_fffffffffffffe38);
    local_209 = 1;
    std::operator<<(poVar1,local_208);
  }
  if ((local_209 & 1) != 0) {
    std::__cxx11::string::~string(local_208);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"bloom_filter_length=");
  poVar1 = local_10;
  local_231 = 0;
  if ((*(byte *)(in_RDI + 0x1a0) >> 6 & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<int>((int *)in_stack_fffffffffffffe38);
    local_231 = 1;
    std::operator<<(poVar1,local_230);
  }
  if ((local_231 & 1) != 0) {
    std::__cxx11::string::~string(local_230);
  }
  poVar1 = std::operator<<(local_10,", ");
  std::operator<<(poVar1,"size_statistics=");
  poVar1 = local_10;
  if (*(char *)(in_RDI + 0x1a0) < '\0') {
    duckdb_apache::thrift::to_string<duckdb_parquet::SizeStatistics>
              ((SizeStatistics *)in_stack_fffffffffffffe38);
    std::operator<<(poVar1,local_258);
    std::__cxx11::string::~string(local_258);
  }
  else {
    std::operator<<(local_10,"<null>");
  }
  std::operator<<(local_10,")");
  return;
}

Assistant:

void ColumnMetaData::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "ColumnMetaData(";
  out << "type=" << to_string(type);
  out << ", " << "encodings=" << to_string(encodings);
  out << ", " << "path_in_schema=" << to_string(path_in_schema);
  out << ", " << "codec=" << to_string(codec);
  out << ", " << "num_values=" << to_string(num_values);
  out << ", " << "total_uncompressed_size=" << to_string(total_uncompressed_size);
  out << ", " << "total_compressed_size=" << to_string(total_compressed_size);
  out << ", " << "key_value_metadata="; (__isset.key_value_metadata ? (out << to_string(key_value_metadata)) : (out << "<null>"));
  out << ", " << "data_page_offset=" << to_string(data_page_offset);
  out << ", " << "index_page_offset="; (__isset.index_page_offset ? (out << to_string(index_page_offset)) : (out << "<null>"));
  out << ", " << "dictionary_page_offset="; (__isset.dictionary_page_offset ? (out << to_string(dictionary_page_offset)) : (out << "<null>"));
  out << ", " << "statistics="; (__isset.statistics ? (out << to_string(statistics)) : (out << "<null>"));
  out << ", " << "encoding_stats="; (__isset.encoding_stats ? (out << to_string(encoding_stats)) : (out << "<null>"));
  out << ", " << "bloom_filter_offset="; (__isset.bloom_filter_offset ? (out << to_string(bloom_filter_offset)) : (out << "<null>"));
  out << ", " << "bloom_filter_length="; (__isset.bloom_filter_length ? (out << to_string(bloom_filter_length)) : (out << "<null>"));
  out << ", " << "size_statistics="; (__isset.size_statistics ? (out << to_string(size_statistics)) : (out << "<null>"));
  out << ")";
}